

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O3

void google::protobuf::anon_unknown_0::ExpectContainsType
               (FileDescriptorProto *proto,string *type_name)

{
  size_t __n;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  undefined8 *puVar3;
  int index;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  
  if (0 < *(int *)((long)&proto->field_0 + 0x28)) {
    index = 0;
    do {
      pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,index);
      puVar3 = (undefined8 *)
               ((ulong)(pVVar2->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      __n = puVar3[1];
      if (__n == type_name->_M_string_length) {
        if (__n == 0) {
          return;
        }
        iVar1 = bcmp((void *)*puVar3,(type_name->_M_dataplus)._M_p,__n);
        if (iVar1 == 0) {
          return;
        }
      }
      index = index + 1;
    } while (index < *(int *)((long)&proto->field_0 + 0x28));
  }
  testing::Message::Message((Message *)&local_30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),"\"",1);
  puVar3 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),(char *)*puVar3,puVar3[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),"\" did not contain expected type \"",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),(type_name->_M_dataplus)._M_p,
             type_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_30._M_head_impl + 0x10),"\".",2);
  testing::internal::AssertHelper::AssertHelper
            (&local_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
             ,0x2b,"Failed");
  testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void ExpectContainsType(const FileDescriptorProto& proto,
                               const std::string& type_name) {
  for (int i = 0; i < proto.message_type_size(); i++) {
    if (proto.message_type(i).name() == type_name) return;
  }
  ADD_FAILURE() << "\"" << proto.name() << "\" did not contain expected type \""
                << type_name << "\".";
}